

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O0

EulerAngles *
AML::integrateEulerAngles
          (EulerAngles *__return_storage_ptr__,EulerAngles *angles,EulerAngles *angleRates,double dt
          )

{
  undefined4 uVar1;
  EulerSequence seq_00;
  EulerSequence EVar2;
  double psiNew;
  double thetaNew;
  double phiNew;
  EulerSequence seq;
  double dt_local;
  EulerAngles *angleRates_local;
  EulerAngles *angles_local;
  
  seq_00 = EulerAngles::getEulerSequence(angles);
  EVar2 = EulerAngles::getEulerSequence(angleRates);
  if (seq_00 == EVar2) {
    EulerAngles::EulerAngles
              (__return_storage_ptr__,angleRates->phi * dt + angles->phi,
               angleRates->theta * dt + angles->theta,angleRates->psi * dt + angles->psi,seq_00);
  }
  else {
    __return_storage_ptr__->phi = angles->phi;
    __return_storage_ptr__->theta = angles->theta;
    __return_storage_ptr__->psi = angles->psi;
    uVar1 = *(undefined4 *)&angles->field_0x1c;
    __return_storage_ptr__->seq_ = angles->seq_;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

EulerAngles integrateEulerAngles(const EulerAngles& angles, const EulerAngles& angleRates, double dt)
    {
        EulerAngles::EulerSequence seq = angles.getEulerSequence();
        if (seq == angleRates.getEulerSequence())
        {
            double phiNew = angles.phi + angleRates.phi * dt;
            double thetaNew = angles.theta + angleRates.theta * dt;
            double psiNew = angles.psi + angleRates.psi * dt;
            return EulerAngles(phiNew, thetaNew, psiNew, seq);
        }
        return angles;
    }